

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<tm> * __thiscall
cs::allocator_type<cs_impl::any::holder<tm>,64ul,cs_impl::default_allocator_provider>::alloc<tm&>
          (allocator_type<cs_impl::any::holder<tm>,64ul,cs_impl::default_allocator_provider> *this,
          tm *args)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  holder<tm> *phVar11;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    phVar11 = (holder<tm> *)operator_new(0x40);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    phVar11 = *(holder<tm> **)(this + lVar1 * 8 + -8);
  }
  (phVar11->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_0024f3a8;
  iVar2 = args->tm_min;
  iVar3 = args->tm_hour;
  iVar4 = args->tm_mday;
  iVar5 = args->tm_mon;
  iVar6 = args->tm_year;
  iVar7 = args->tm_wday;
  iVar8 = args->tm_yday;
  iVar9 = args->tm_isdst;
  uVar10 = *(undefined4 *)&args->field_0x24;
  lVar1 = args->tm_gmtoff;
  (phVar11->mDat).tm_sec = args->tm_sec;
  (phVar11->mDat).tm_min = iVar2;
  (phVar11->mDat).tm_hour = iVar3;
  (phVar11->mDat).tm_mday = iVar4;
  (phVar11->mDat).tm_mon = iVar5;
  (phVar11->mDat).tm_year = iVar6;
  (phVar11->mDat).tm_wday = iVar7;
  (phVar11->mDat).tm_yday = iVar8;
  (phVar11->mDat).tm_isdst = iVar9;
  *(undefined4 *)&(phVar11->mDat).field_0x24 = uVar10;
  (phVar11->mDat).tm_gmtoff = lVar1;
  (phVar11->mDat).tm_zone = args->tm_zone;
  return phVar11;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}